

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_striped_sse2_128_16.c
# Opt level: O1

parasail_result_t *
parasail_sw_striped_profile_sse2_128_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  ushort *puVar1;
  short *psVar2;
  uint uVar3;
  void *pvVar4;
  parasail_matrix_t *ppVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  uint uVar11;
  ulong uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  int iVar15;
  parasail_result_t *result;
  __m128i *b;
  __m128i *palVar16;
  __m128i *palVar17;
  __m128i *b_00;
  bool bVar18;
  undefined4 in_register_0000000c;
  undefined8 uVar19;
  undefined8 extraout_RDX;
  __m128i *ptr;
  int iVar20;
  ulong uVar21;
  int iVar22;
  long lVar23;
  __m128i *palVar24;
  ulong uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined1 auVar28 [16];
  short sVar29;
  short sVar30;
  undefined1 auVar31 [16];
  short sVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  short sVar40;
  short sVar41;
  short sVar42;
  short sVar43;
  short sVar44;
  short sVar45;
  short sVar46;
  undefined1 auVar39 [16];
  ushort uVar47;
  ushort uVar50;
  ushort uVar51;
  ushort uVar52;
  ushort uVar53;
  ushort uVar54;
  ushort uVar55;
  ushort uVar56;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  __m128i c;
  __m128i c_00;
  ulong local_98;
  ulong local_90;
  size_t len;
  longlong extraout_RDX_00;
  short sVar57;
  
  uVar19 = CONCAT44(in_register_0000000c,open);
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sw_striped_profile_sse2_128_16_cold_8();
  }
  else {
    pvVar4 = (profile->profile16).score;
    if (pvVar4 == (void *)0x0) {
      parasail_sw_striped_profile_sse2_128_16_cold_7();
    }
    else {
      ppVar5 = profile->matrix;
      if (ppVar5 == (parasail_matrix_t *)0x0) {
        parasail_sw_striped_profile_sse2_128_16_cold_6();
      }
      else {
        uVar3 = profile->s1Len;
        if ((int)uVar3 < 1) {
          parasail_sw_striped_profile_sse2_128_16_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sw_striped_profile_sse2_128_16_cold_4();
        }
        else if (s2Len < 1) {
          parasail_sw_striped_profile_sse2_128_16_cold_3();
        }
        else if (open < 0) {
          parasail_sw_striped_profile_sse2_128_16_cold_2();
        }
        else if (gap < 0) {
          parasail_sw_striped_profile_sse2_128_16_cold_1();
        }
        else {
          iVar15 = ppVar5->max;
          result = parasail_result_new();
          if (result != (parasail_result_t *)0x0) {
            uVar25 = (ulong)uVar3 + 7 >> 3;
            result->flag = result->flag | 0x8200804;
            b = parasail_memalign___m128i(0x10,uVar25);
            palVar16 = parasail_memalign___m128i(0x10,uVar25);
            palVar17 = parasail_memalign___m128i(0x10,uVar25);
            b_00 = parasail_memalign___m128i(0x10,uVar25);
            bVar18 = palVar16 == (__m128i *)0x0 || b == (__m128i *)0x0;
            len = CONCAT71((int7)((ulong)uVar19 >> 8),bVar18);
            c[1]._1_7_ = (undefined7)((ulong)extraout_RDX >> 8);
            c[1]._0_1_ = (b_00 == (__m128i *)0x0 || palVar17 == (__m128i *)0x0) || bVar18;
            if ((b_00 != (__m128i *)0x0 && palVar17 != (__m128i *)0x0) &&
                (palVar16 != (__m128i *)0x0 && b != (__m128i *)0x0)) {
              local_90 = 0;
              auVar28 = pshuflw(ZEXT416((uint)open),ZEXT416((uint)open),0);
              uVar26 = auVar28._0_4_;
              auVar28 = pshuflw(ZEXT416((uint)gap),ZEXT416((uint)gap),0);
              uVar27 = auVar28._0_4_;
              c[0] = uVar25;
              parasail_memset___m128i(b,c,len);
              c_00[1] = extraout_RDX_00;
              c_00[0] = uVar25;
              parasail_memset___m128i(b_00,c_00,len);
              auVar14 = _DAT_008d0de0;
              auVar28._4_4_ = uVar27;
              auVar28._0_4_ = uVar27;
              auVar28._8_4_ = uVar27;
              auVar28._12_4_ = uVar27;
              auVar13._4_4_ = uVar26;
              auVar13._0_4_ = uVar26;
              auVar13._8_4_ = uVar26;
              auVar13._12_4_ = uVar26;
              uVar11 = (uint)uVar25;
              auVar35._0_4_ = 0x8000;
              uVar21 = 0;
              auVar37 = _DAT_008d0de0;
              auVar31 = _DAT_008d0de0;
              do {
                ptr = b;
                iVar22 = ppVar5->mapper[(byte)s2[uVar21]];
                palVar24 = palVar17;
                b = palVar16;
                if ((int)local_90 == (int)uVar21 + -2) {
                  palVar24 = palVar16;
                  b = palVar17;
                }
                uVar12 = ptr[uVar11 - 1][0];
                auVar36._0_8_ = uVar12 << 0x10;
                auVar36._8_8_ = ptr[uVar11 - 1][1] << 0x10 | uVar12 >> 0x30;
                auVar36 = auVar36 | ZEXT416(0x8000);
                lVar23 = 0;
                auVar49 = auVar37;
                auVar33 = auVar14;
                do {
                  auVar37 = paddsw(auVar36,*(undefined1 (*) [16])
                                            ((long)pvVar4 + lVar23 + uVar25 * (long)iVar22 * 0x10));
                  auVar36 = *(undefined1 (*) [16])((long)*b_00 + lVar23);
                  sVar29 = auVar33._0_2_;
                  sVar30 = auVar36._0_2_;
                  uVar47 = (ushort)(sVar30 < sVar29) * sVar29 | (ushort)(sVar30 >= sVar29) * sVar30;
                  sVar29 = auVar33._2_2_;
                  sVar30 = auVar36._2_2_;
                  uVar50 = (ushort)(sVar30 < sVar29) * sVar29 | (ushort)(sVar30 >= sVar29) * sVar30;
                  sVar29 = auVar33._4_2_;
                  sVar30 = auVar36._4_2_;
                  uVar51 = (ushort)(sVar30 < sVar29) * sVar29 | (ushort)(sVar30 >= sVar29) * sVar30;
                  sVar29 = auVar33._6_2_;
                  sVar30 = auVar36._6_2_;
                  uVar52 = (ushort)(sVar30 < sVar29) * sVar29 | (ushort)(sVar30 >= sVar29) * sVar30;
                  sVar29 = auVar33._8_2_;
                  sVar30 = auVar36._8_2_;
                  uVar53 = (ushort)(sVar30 < sVar29) * sVar29 | (ushort)(sVar30 >= sVar29) * sVar30;
                  sVar29 = auVar33._10_2_;
                  sVar30 = auVar36._10_2_;
                  uVar54 = (ushort)(sVar30 < sVar29) * sVar29 | (ushort)(sVar30 >= sVar29) * sVar30;
                  sVar29 = auVar33._12_2_;
                  sVar30 = auVar36._12_2_;
                  sVar57 = auVar36._14_2_;
                  uVar55 = (ushort)(sVar30 < sVar29) * sVar29 | (ushort)(sVar30 >= sVar29) * sVar30;
                  sVar29 = auVar33._14_2_;
                  uVar56 = (ushort)(sVar57 < sVar29) * sVar29 | (ushort)(sVar57 >= sVar29) * sVar57;
                  sVar29 = auVar37._0_2_;
                  auVar48._0_2_ =
                       (ushort)((short)uVar47 < sVar29) * sVar29 |
                       ((short)uVar47 >= sVar29) * uVar47;
                  sVar29 = auVar37._2_2_;
                  auVar48._2_2_ =
                       (ushort)((short)uVar50 < sVar29) * sVar29 |
                       ((short)uVar50 >= sVar29) * uVar50;
                  sVar29 = auVar37._4_2_;
                  auVar48._4_2_ =
                       (ushort)((short)uVar51 < sVar29) * sVar29 |
                       ((short)uVar51 >= sVar29) * uVar51;
                  sVar29 = auVar37._6_2_;
                  auVar48._6_2_ =
                       (ushort)((short)uVar52 < sVar29) * sVar29 |
                       ((short)uVar52 >= sVar29) * uVar52;
                  sVar29 = auVar37._8_2_;
                  auVar48._8_2_ =
                       (ushort)((short)uVar53 < sVar29) * sVar29 |
                       ((short)uVar53 >= sVar29) * uVar53;
                  sVar29 = auVar37._10_2_;
                  auVar48._10_2_ =
                       (ushort)((short)uVar54 < sVar29) * sVar29 |
                       ((short)uVar54 >= sVar29) * uVar54;
                  sVar29 = auVar37._12_2_;
                  auVar48._12_2_ =
                       (ushort)((short)uVar55 < sVar29) * sVar29 |
                       ((short)uVar55 >= sVar29) * uVar55;
                  sVar29 = auVar37._14_2_;
                  auVar48._14_2_ =
                       (ushort)((short)uVar56 < sVar29) * sVar29 |
                       ((short)uVar56 >= sVar29) * uVar56;
                  *(undefined1 (*) [16])((long)*b + lVar23) = auVar48;
                  sVar29 = auVar49._0_2_;
                  auVar37._0_2_ =
                       (sVar29 < (short)auVar48._0_2_) * auVar48._0_2_ |
                       (ushort)(sVar29 >= (short)auVar48._0_2_) * sVar29;
                  sVar29 = auVar49._2_2_;
                  auVar37._2_2_ =
                       (sVar29 < (short)auVar48._2_2_) * auVar48._2_2_ |
                       (ushort)(sVar29 >= (short)auVar48._2_2_) * sVar29;
                  sVar29 = auVar49._4_2_;
                  auVar37._4_2_ =
                       (sVar29 < (short)auVar48._4_2_) * auVar48._4_2_ |
                       (ushort)(sVar29 >= (short)auVar48._4_2_) * sVar29;
                  sVar29 = auVar49._6_2_;
                  auVar37._6_2_ =
                       (sVar29 < (short)auVar48._6_2_) * auVar48._6_2_ |
                       (ushort)(sVar29 >= (short)auVar48._6_2_) * sVar29;
                  sVar29 = auVar49._8_2_;
                  auVar37._8_2_ =
                       (sVar29 < (short)auVar48._8_2_) * auVar48._8_2_ |
                       (ushort)(sVar29 >= (short)auVar48._8_2_) * sVar29;
                  sVar29 = auVar49._10_2_;
                  auVar37._10_2_ =
                       (sVar29 < (short)auVar48._10_2_) * auVar48._10_2_ |
                       (ushort)(sVar29 >= (short)auVar48._10_2_) * sVar29;
                  sVar29 = auVar49._12_2_;
                  sVar30 = auVar49._14_2_;
                  auVar37._12_2_ =
                       (sVar29 < (short)auVar48._12_2_) * auVar48._12_2_ |
                       (ushort)(sVar29 >= (short)auVar48._12_2_) * sVar29;
                  auVar37._14_2_ =
                       (sVar30 < (short)auVar48._14_2_) * auVar48._14_2_ |
                       (ushort)(sVar30 >= (short)auVar48._14_2_) * sVar30;
                  auVar49 = psubsw(auVar48,auVar13);
                  auVar36 = psubsw(auVar36,auVar28);
                  sVar29 = auVar49._0_2_;
                  sVar32 = auVar36._0_2_;
                  sVar30 = auVar49._2_2_;
                  sVar40 = auVar36._2_2_;
                  sVar57 = auVar49._4_2_;
                  sVar41 = auVar36._4_2_;
                  sVar6 = auVar49._6_2_;
                  sVar42 = auVar36._6_2_;
                  sVar7 = auVar49._8_2_;
                  sVar43 = auVar36._8_2_;
                  sVar8 = auVar49._10_2_;
                  sVar44 = auVar36._10_2_;
                  sVar9 = auVar49._12_2_;
                  sVar45 = auVar36._12_2_;
                  sVar46 = auVar36._14_2_;
                  sVar10 = auVar49._14_2_;
                  puVar1 = (ushort *)((long)*b_00 + lVar23);
                  *puVar1 = (ushort)(sVar32 < sVar29) * sVar29 | (ushort)(sVar32 >= sVar29) * sVar32
                  ;
                  puVar1[1] = (ushort)(sVar40 < sVar30) * sVar30 |
                              (ushort)(sVar40 >= sVar30) * sVar40;
                  puVar1[2] = (ushort)(sVar41 < sVar57) * sVar57 |
                              (ushort)(sVar41 >= sVar57) * sVar41;
                  puVar1[3] = (ushort)(sVar42 < sVar6) * sVar6 | (ushort)(sVar42 >= sVar6) * sVar42;
                  puVar1[4] = (ushort)(sVar43 < sVar7) * sVar7 | (ushort)(sVar43 >= sVar7) * sVar43;
                  puVar1[5] = (ushort)(sVar44 < sVar8) * sVar8 | (ushort)(sVar44 >= sVar8) * sVar44;
                  puVar1[6] = (ushort)(sVar45 < sVar9) * sVar9 | (ushort)(sVar45 >= sVar9) * sVar45;
                  puVar1[7] = (ushort)(sVar46 < sVar10) * sVar10 |
                              (ushort)(sVar46 >= sVar10) * sVar46;
                  auVar36 = psubsw(auVar33,auVar28);
                  sVar32 = auVar36._0_2_;
                  auVar33._0_2_ =
                       (ushort)(sVar32 < sVar29) * sVar29 | (ushort)(sVar32 >= sVar29) * sVar32;
                  sVar29 = auVar36._2_2_;
                  auVar33._2_2_ =
                       (ushort)(sVar29 < sVar30) * sVar30 | (ushort)(sVar29 >= sVar30) * sVar29;
                  sVar29 = auVar36._4_2_;
                  auVar33._4_2_ =
                       (ushort)(sVar29 < sVar57) * sVar57 | (ushort)(sVar29 >= sVar57) * sVar29;
                  sVar29 = auVar36._6_2_;
                  auVar33._6_2_ =
                       (ushort)(sVar29 < sVar6) * sVar6 | (ushort)(sVar29 >= sVar6) * sVar29;
                  sVar29 = auVar36._8_2_;
                  auVar33._8_2_ =
                       (ushort)(sVar29 < sVar7) * sVar7 | (ushort)(sVar29 >= sVar7) * sVar29;
                  sVar29 = auVar36._10_2_;
                  auVar33._10_2_ =
                       (ushort)(sVar29 < sVar8) * sVar8 | (ushort)(sVar29 >= sVar8) * sVar29;
                  sVar29 = auVar36._12_2_;
                  sVar30 = auVar36._14_2_;
                  auVar33._12_2_ =
                       (ushort)(sVar29 < sVar9) * sVar9 | (ushort)(sVar29 >= sVar9) * sVar29;
                  auVar33._14_2_ =
                       (ushort)(sVar30 < sVar10) * sVar10 | (ushort)(sVar30 >= sVar10) * sVar30;
                  auVar36 = *(undefined1 (*) [16])((long)*ptr + lVar23);
                  lVar23 = lVar23 + 0x10;
                  auVar49 = auVar37;
                } while (uVar25 << 4 != lVar23);
                iVar22 = 0;
                do {
                  auVar49._0_8_ = auVar33._0_8_ << 0x10;
                  auVar49._8_8_ = auVar33._8_8_ << 0x10 | auVar33._0_8_ >> 0x30;
                  auVar33 = auVar49 | ZEXT416(0x8000);
                  lVar23 = 0;
                  auVar36 = auVar37;
                  do {
                    psVar2 = (short *)((long)*b + lVar23);
                    sVar30 = *psVar2;
                    sVar57 = psVar2[1];
                    sVar6 = psVar2[2];
                    sVar7 = psVar2[3];
                    sVar8 = psVar2[4];
                    sVar9 = psVar2[5];
                    sVar10 = psVar2[6];
                    sVar32 = psVar2[7];
                    sVar29 = auVar33._0_2_;
                    auVar38._0_2_ =
                         (ushort)(sVar30 < sVar29) * sVar29 | (ushort)(sVar30 >= sVar29) * sVar30;
                    sVar29 = auVar33._2_2_;
                    auVar38._2_2_ =
                         (ushort)(sVar57 < sVar29) * sVar29 | (ushort)(sVar57 >= sVar29) * sVar57;
                    sVar29 = auVar33._4_2_;
                    auVar38._4_2_ =
                         (ushort)(sVar6 < sVar29) * sVar29 | (ushort)(sVar6 >= sVar29) * sVar6;
                    sVar29 = auVar33._6_2_;
                    auVar38._6_2_ =
                         (ushort)(sVar7 < sVar29) * sVar29 | (ushort)(sVar7 >= sVar29) * sVar7;
                    sVar29 = auVar33._8_2_;
                    auVar38._8_2_ =
                         (ushort)(sVar8 < sVar29) * sVar29 | (ushort)(sVar8 >= sVar29) * sVar8;
                    sVar29 = auVar33._10_2_;
                    auVar38._10_2_ =
                         (ushort)(sVar9 < sVar29) * sVar29 | (ushort)(sVar9 >= sVar29) * sVar9;
                    sVar29 = auVar33._12_2_;
                    auVar38._12_2_ =
                         (ushort)(sVar10 < sVar29) * sVar29 | (ushort)(sVar10 >= sVar29) * sVar10;
                    sVar29 = auVar33._14_2_;
                    auVar38._14_2_ =
                         (ushort)(sVar32 < sVar29) * sVar29 | (ushort)(sVar32 >= sVar29) * sVar32;
                    *(undefined1 (*) [16])((long)*b + lVar23) = auVar38;
                    sVar29 = auVar36._0_2_;
                    auVar37._0_2_ =
                         (sVar29 < (short)auVar38._0_2_) * auVar38._0_2_ |
                         (ushort)(sVar29 >= (short)auVar38._0_2_) * sVar29;
                    sVar29 = auVar36._2_2_;
                    auVar37._2_2_ =
                         (sVar29 < (short)auVar38._2_2_) * auVar38._2_2_ |
                         (ushort)(sVar29 >= (short)auVar38._2_2_) * sVar29;
                    sVar29 = auVar36._4_2_;
                    auVar37._4_2_ =
                         (sVar29 < (short)auVar38._4_2_) * auVar38._4_2_ |
                         (ushort)(sVar29 >= (short)auVar38._4_2_) * sVar29;
                    sVar29 = auVar36._6_2_;
                    auVar37._6_2_ =
                         (sVar29 < (short)auVar38._6_2_) * auVar38._6_2_ |
                         (ushort)(sVar29 >= (short)auVar38._6_2_) * sVar29;
                    sVar29 = auVar36._8_2_;
                    auVar37._8_2_ =
                         (sVar29 < (short)auVar38._8_2_) * auVar38._8_2_ |
                         (ushort)(sVar29 >= (short)auVar38._8_2_) * sVar29;
                    sVar29 = auVar36._10_2_;
                    auVar37._10_2_ =
                         (sVar29 < (short)auVar38._10_2_) * auVar38._10_2_ |
                         (ushort)(sVar29 >= (short)auVar38._10_2_) * sVar29;
                    sVar29 = auVar36._12_2_;
                    sVar30 = auVar36._14_2_;
                    auVar37._12_2_ =
                         (sVar29 < (short)auVar38._12_2_) * auVar38._12_2_ |
                         (ushort)(sVar29 >= (short)auVar38._12_2_) * sVar29;
                    auVar37._14_2_ =
                         (sVar30 < (short)auVar38._14_2_) * auVar38._14_2_ |
                         (ushort)(sVar30 >= (short)auVar38._14_2_) * sVar30;
                    auVar36 = psubsw(auVar38,auVar13);
                    auVar33 = psubsw(auVar33,auVar28);
                    auVar39._0_2_ = -(ushort)(auVar36._0_2_ < auVar33._0_2_);
                    auVar39._2_2_ = -(ushort)(auVar36._2_2_ < auVar33._2_2_);
                    auVar39._4_2_ = -(ushort)(auVar36._4_2_ < auVar33._4_2_);
                    auVar39._6_2_ = -(ushort)(auVar36._6_2_ < auVar33._6_2_);
                    auVar39._8_2_ = -(ushort)(auVar36._8_2_ < auVar33._8_2_);
                    auVar39._10_2_ = -(ushort)(auVar36._10_2_ < auVar33._10_2_);
                    auVar39._12_2_ = -(ushort)(auVar36._12_2_ < auVar33._12_2_);
                    auVar39._14_2_ = -(ushort)(auVar36._14_2_ < auVar33._14_2_);
                    if ((((((((((((((((auVar39 >> 7 & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0 &&
                                     (auVar39 >> 0xf & (undefined1  [16])0x1) ==
                                     (undefined1  [16])0x0) &&
                                    (auVar39 >> 0x17 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                                   (auVar39 >> 0x1f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                                  (auVar39 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                  ) && (auVar39 >> 0x2f & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                (auVar39 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar39 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar39 >> 0x47 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                             (auVar39 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar39 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar39 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar39 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar39 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar39._14_2_ >> 7 & 1) == 0) && (auVar39._14_2_ & 0x8000) == 0)
                    goto LAB_005731ae;
                    lVar23 = lVar23 + 0x10;
                    auVar36 = auVar37;
                  } while (uVar25 << 4 != lVar23);
                  iVar22 = iVar22 + 1;
                } while (iVar22 != 8);
LAB_005731ae:
                auVar34._0_2_ = -(ushort)(auVar31._0_2_ < (short)auVar37._0_2_);
                auVar34._2_2_ = -(ushort)(auVar31._2_2_ < (short)auVar37._2_2_);
                auVar34._4_2_ = -(ushort)(auVar31._4_2_ < (short)auVar37._4_2_);
                auVar34._6_2_ = -(ushort)(auVar31._6_2_ < (short)auVar37._6_2_);
                auVar34._8_2_ = -(ushort)(auVar31._8_2_ < (short)auVar37._8_2_);
                auVar34._10_2_ = -(ushort)(auVar31._10_2_ < (short)auVar37._10_2_);
                auVar34._12_2_ = -(ushort)(auVar31._12_2_ < (short)auVar37._12_2_);
                auVar34._14_2_ = -(ushort)(auVar31._14_2_ < (short)auVar37._14_2_);
                bVar18 = true;
                if ((((((((((((((((auVar34 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                                 (auVar34 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                                || (auVar34 >> 0x17 & (undefined1  [16])0x1) !=
                                   (undefined1  [16])0x0) ||
                               (auVar34 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                              || (auVar34 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                             || (auVar34 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                            || (auVar34 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                           || (auVar34 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar34 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar34 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar34 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar34 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar34 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar34 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar34._14_2_ >> 7 & 1) != 0) || (auVar34._14_2_ & 0x8000) != 0) {
                  uVar47 = ((short)auVar37._8_2_ < (short)auVar37._0_2_) * auVar37._0_2_ |
                           ((short)auVar37._8_2_ >= (short)auVar37._0_2_) * auVar37._8_2_;
                  uVar50 = ((short)auVar37._10_2_ < (short)auVar37._2_2_) * auVar37._2_2_ |
                           ((short)auVar37._10_2_ >= (short)auVar37._2_2_) * auVar37._10_2_;
                  uVar51 = ((short)auVar37._12_2_ < (short)auVar37._4_2_) * auVar37._4_2_ |
                           ((short)auVar37._12_2_ >= (short)auVar37._4_2_) * auVar37._12_2_;
                  uVar52 = ((short)auVar37._14_2_ < (short)auVar37._6_2_) * auVar37._6_2_ |
                           ((short)auVar37._14_2_ >= (short)auVar37._6_2_) * auVar37._14_2_;
                  sVar29 = (0 < (short)auVar37._8_2_) * auVar37._8_2_;
                  sVar30 = (0 < (short)auVar37._10_2_) * auVar37._10_2_;
                  sVar6 = (0 < (short)auVar37._12_2_) * auVar37._12_2_;
                  sVar57 = (0 < (short)auVar37._14_2_) * auVar37._14_2_;
                  uVar47 = ((short)uVar51 < (short)uVar47) * uVar47 |
                           ((short)uVar51 >= (short)uVar47) * uVar51;
                  uVar50 = ((short)uVar52 < (short)uVar50) * uVar50 |
                           ((short)uVar52 >= (short)uVar50) * uVar52;
                  uVar51 = (sVar29 < (short)uVar51) * uVar51 |
                           (ushort)(sVar29 >= (short)uVar51) * sVar29;
                  uVar52 = (sVar30 < (short)uVar52) * uVar52 |
                           (ushort)(sVar30 >= (short)uVar52) * sVar30;
                  uVar53 = (ushort)(sVar6 < sVar29) * sVar29 | (ushort)(sVar6 >= sVar29) * sVar6;
                  uVar54 = (ushort)(sVar57 < sVar30) * sVar30 | (ushort)(sVar57 >= sVar30) * sVar57;
                  sVar6 = (ushort)(0 < sVar6) * sVar6;
                  sVar57 = (ushort)(0 < sVar57) * sVar57;
                  uVar47 = ((short)uVar50 < (short)uVar47) * uVar47 |
                           ((short)uVar50 >= (short)uVar47) * uVar50;
                  auVar35._0_4_ =
                       CONCAT22(((short)uVar51 < (short)uVar50) * uVar50 |
                                ((short)uVar51 >= (short)uVar50) * uVar51,uVar47);
                  auVar35._4_2_ =
                       ((short)uVar52 < (short)uVar51) * uVar51 |
                       ((short)uVar52 >= (short)uVar51) * uVar52;
                  auVar35._6_2_ =
                       ((short)uVar53 < (short)uVar52) * uVar52 |
                       ((short)uVar53 >= (short)uVar52) * uVar53;
                  auVar35._8_2_ =
                       ((short)uVar54 < (short)uVar53) * uVar53 |
                       ((short)uVar54 >= (short)uVar53) * uVar54;
                  auVar35._10_2_ =
                       (sVar6 < (short)uVar54) * uVar54 | (ushort)(sVar6 >= (short)uVar54) * sVar6;
                  auVar35._12_2_ =
                       (ushort)(sVar57 < sVar6) * sVar6 | (ushort)(sVar57 >= sVar6) * sVar57;
                  auVar35._14_2_ = (ushort)(0 < sVar57) * sVar57;
                  if ((short)(0x7ffe - (short)iVar15) < (short)uVar47) {
                    *(byte *)&result->flag = (byte)result->flag | 0x40;
                    bVar18 = false;
                  }
                  else {
                    auVar31 = pshuflw(auVar31,auVar35,0);
                    auVar31._4_4_ = auVar31._0_4_;
                    auVar31._8_4_ = auVar31._0_4_;
                    auVar31._12_4_ = auVar31._0_4_;
                    local_90 = uVar21 & 0xffffffff;
                  }
                }
                local_98 = uVar21;
                if ((!bVar18) ||
                   (uVar21 = uVar21 + 1, palVar16 = ptr, palVar17 = palVar24,
                   local_98 = (ulong)(uint)s2Len, uVar21 == (uint)s2Len)) {
                  if ((auVar35._0_4_ & 0xffff) == 0x7fff) {
                    *(byte *)&result->flag = (byte)result->flag | 0x40;
                  }
                  iVar15 = parasail_result_is_saturated(result);
                  palVar16 = palVar24;
                  if (iVar15 == 0) {
                    iVar15 = (int)local_90;
                    palVar17 = ptr;
                    if (iVar15 == (int)local_98 + -2) {
                      palVar16 = ptr;
                      palVar17 = palVar24;
                    }
                    if (iVar15 == (int)local_98 + -1) {
                      palVar16 = b;
                      b = palVar24;
                      palVar17 = ptr;
                    }
                    ptr = palVar17;
                    iVar22 = uVar3 - 1;
                    if (((ulong)uVar3 + 7 & 0x7ffffff8) != 0) {
                      uVar25 = 0;
                      do {
                        if ((*(short *)((long)*palVar16 + uVar25 * 2) == (short)auVar35._0_4_) &&
                           (iVar20 = ((uint)uVar25 & 7) * uVar11 +
                                     ((uint)(uVar25 >> 3) & 0x1fffffff), iVar20 < iVar22)) {
                          iVar22 = iVar20;
                        }
                        uVar25 = uVar25 + 1;
                      } while ((uVar11 & 0xfffffff) << 3 != (int)uVar25);
                    }
                    iVar20 = (short)auVar35._0_4_ + 0x8000;
                  }
                  else {
                    iVar15 = 0;
                    iVar20 = 0xffff;
                    iVar22 = 0;
                  }
                  result->score = iVar20;
                  result->end_query = iVar22;
                  result->end_ref = iVar15;
                  parasail_free(b_00);
                  parasail_free(palVar16);
                  parasail_free(ptr);
                  parasail_free(b);
                  return result;
                }
              } while( true );
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i* restrict pvE = NULL;
    __m128i vGapO;
    __m128i vGapE;
    __m128i vZero;
    int16_t bias = 0;
    int16_t score = 0;
    __m128i vBias;
    __m128i vMaxH;
    __m128i vMaxHUnit;
    int16_t maxp = 0;
    __m128i insert_mask;
    /*int16_t stop = 0;*/
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    vProfile = (__m128i*)profile->profile16.score;
    vGapO = _mm_set1_epi16(open);
    vGapE = _mm_set1_epi16(gap);
    vZero = _mm_set1_epi16(0);
    bias = INT16_MIN;
    score = bias;
    vBias = _mm_set1_epi16(bias);
    vMaxH = vBias;
    vMaxHUnit = vBias;
    maxp = INT16_MAX - (int16_t)(matrix->max+1);
    insert_mask = _mm_cmpgt_epi16(
            _mm_set_epi16(0,0,0,0,0,0,0,1),
            vZero);
    /*stop = profile->stop == INT32_MAX ?  INT16_MAX : (int16_t)profile->stop-bias;*/

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad = parasail_memalign___m128i(16, segLen);
    pvHMax = parasail_memalign___m128i(16, segLen);
    pvE = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMax) return NULL;
    if (!pvE) return NULL;

    /* initialize H and E */
    parasail_memset___m128i(pvHStore, vBias, segLen);
    parasail_memset___m128i(pvE, vBias, segLen);

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vF;
        __m128i vH;
        const __m128i* vP = NULL;
        __m128i* pv = NULL;

        /* Initialize F value to 0.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        vF = vBias;

        /* load final segment of pvHStore and shift left by 2 bytes */
        vH = _mm_slli_si128(pvHStore[segLen - 1], 2);
        vH = _mm_blendv_epi8_rpl(vH, vBias, insert_mask);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        if (end_ref == j-2) {
            /* Swap in the max buffer. */
            pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }
        else {
            /* Swap the 2 H buffers. */
            pv = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm_adds_epi16(vH, _mm_load_si128(vP + i));
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm_max_epi16(vH, vE);
            vH = _mm_max_epi16(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len, bias);
#endif
            vMaxH = _mm_max_epi16(vH, vMaxH);

            /* Update vE value. */
            vH = _mm_subs_epi16(vH, vGapO);
            vE = _mm_subs_epi16(vE, vGapE);
            vE = _mm_max_epi16(vE, vH);
            _mm_store_si128(pvE + i, vE);

            /* Update vF value. */
            vF = _mm_subs_epi16(vF, vGapE);
            vF = _mm_max_epi16(vF, vH);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            vF = _mm_slli_si128(vF, 2);
            vF = _mm_blendv_epi8_rpl(vF, vBias, insert_mask);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi16(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len, bias);
#endif
                vMaxH = _mm_max_epi16(vH, vMaxH);
                vH = _mm_subs_epi16(vH, vGapO);
                vF = _mm_subs_epi16(vF, vGapE);
                if (! _mm_movemask_epi8(_mm_cmpgt_epi16(vF, vH))) goto end;
                /*vF = _mm_max_epi16(vF, vH);*/
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 2);
            }
            result->rowcols->score_row[j] = (int16_t) _mm_extract_epi16 (vH, 7) - bias;
        }
#endif

        {
            __m128i vCompare = _mm_cmpgt_epi16(vMaxH, vMaxHUnit);
            if (_mm_movemask_epi8(vCompare)) {
                score = _mm_hmax_epi16_rpl(vMaxH);
                /* if score has potential to overflow, abort early */
                if (score > maxp) {
                    result->flag |= PARASAIL_FLAG_SATURATED;
                    break;
                }
                vMaxHUnit = _mm_set1_epi16(score);
                end_ref = j;
            }
        }

        /*if (score == stop) break;*/
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen, bias);
    }
#endif

    if (score == INT16_MAX) {
        result->flag |= PARASAIL_FLAG_SATURATED;
    }

    if (parasail_result_is_saturated(result)) {
        score = INT16_MAX;
        end_query = 0;
        end_ref = 0;
    }
    else {
        if (end_ref == j-1) {
            /* end_ref was the last store column */
            __m128i *pv = pvHMax;
            pvHMax = pvHStore;
            pvHStore = pv;
        }
        else if (end_ref == j-2) {
            /* end_ref was the last load column */
            __m128i *pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pv;
        }
        /* Trace the alignment ending position on read. */
        {
            int16_t *t = (int16_t*)pvHMax;
            int32_t column_len = segLen * segWidth;
            end_query = s1Len - 1;
            for (i = 0; i<column_len; ++i, ++t) {
                if (*t == score) {
                    int32_t temp = i / segWidth + i % segWidth * segLen;
                    if (temp < end_query) {
                        end_query = temp;
                    }
                }
            }
        }
    }

    result->score = score - bias;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvE);
    parasail_free(pvHMax);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}